

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinSerializer<std::map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_void>
     ::serialize_elems<binlog::detail::QueueWriter>(long param_1,undefined8 param_2,long param_3)

{
  long lVar1;
  _Base_ptr p_Var2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  undefined1 *__dest;
  ulong __n;
  
  p_Var4 = *(_Rb_tree_node_base **)(param_1 + 0x18);
  if (p_Var4 != (_Rb_tree_node_base *)(param_1 + 8)) {
    __dest = *(undefined1 **)(param_3 + 8);
    do {
      *__dest = (char)p_Var4[1]._M_color;
      lVar1 = *(long *)(param_3 + 8);
      *(long *)(param_3 + 8) = lVar1 + 1;
      p_Var2 = p_Var4[1]._M_left;
      iVar3 = (int)p_Var2;
      *(int *)(lVar1 + 1) = iVar3;
      __dest = (undefined1 *)(*(long *)(param_3 + 8) + 4);
      *(undefined1 **)(param_3 + 8) = __dest;
      if (iVar3 != 0) {
        __n = (ulong)p_Var2 & 0xffffffff;
        memcpy(__dest,p_Var4[1]._M_parent,__n);
        __dest = (undefined1 *)(__n + *(long *)(param_3 + 8));
        *(undefined1 **)(param_3 + 8) = __dest;
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)(param_1 + 8));
  }
  return;
}

Assistant:

static void serialize_elems(
    std::false_type /* no batch copy */,
    const Sequence& s, std::uint32_t /* size */, OutputStream& ostream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::serialize<value_type>(elem, ostream);
    }
  }